

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall ktx::ValidationContext::validateLevelIndex(ValidationContext *this)

{
  undefined2 uVar1;
  ktx_uint32_t kVar2;
  ktx_uint64_t kVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  pointer pkVar7;
  long lVar8;
  size_t sVar9;
  int iVar10;
  unsigned_long *args_1;
  int iVar11;
  size_t firstLevelOffset;
  uint uVar12;
  uint uVar13;
  IssueError *issue;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint32_t level;
  bool bVar17;
  unsigned_long expectedOffset;
  uint32_t index;
  size_t expectedLength;
  size_t requiredLevelAlignment;
  unsigned_long local_60;
  uint32_t local_54;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::resize
            (&this->levelIndices,(ulong)this->numLevels);
  lVar16 = (ulong)this->numLevels * 0x18;
  (*this->_vptr_ValidationContext[2])
            (this,0x50,
             (this->levelIndices).
             super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl.
             super__Vector_impl_data._M_start,lVar16,0xf,"the level index");
  if ((this->expectedBytePlanes).super__Optional_base<std::array<unsigned_char,_8UL>,_true,_true>.
      _M_payload.super__Optional_payload_base<std::array<unsigned_char,_8UL>_>._M_engaged == true) {
    bVar5 = (this->expectedBytePlanes).
            super__Optional_base<std::array<unsigned_char,_8UL>,_true,_true>._M_payload.
            super__Optional_payload_base<std::array<unsigned_char,_8UL>_>._M_payload._M_value.
            _M_elems[0];
  }
  else {
    uVar1 = this->parsedBlockByteLength;
    bVar5 = 0;
    if ((this->parsedBlockByteLength).super__Optional_base<unsigned_char,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_char>._M_engaged != false) {
      bVar5 = (char)uVar1 + ((char)uVar1 == '\0');
    }
  }
  local_48 = 1;
  if ((this->header).supercompressionScheme == 0) {
    if (bVar5 == 0) {
      local_48 = 0;
    }
    else {
      iVar10 = 0;
      if (bVar5 != 0) {
        for (; (bVar5 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
        }
      }
      bVar4 = bVar5 >> ((byte)iVar10 & 0x1f);
      iVar11 = 2;
      if (iVar10 < 2) {
        iVar11 = iVar10;
      }
      uVar12 = (uint)(bVar4 != 0);
      if (bVar4 != 1) {
        uVar15 = 1;
        uVar14 = (uint)bVar4;
        uVar13 = (uint)(bVar4 != 0);
        do {
          if (uVar15 < uVar14) {
            uVar15 = uVar14;
          }
          uVar15 = uVar15 - uVar13;
          iVar10 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
            }
          }
          uVar15 = uVar15 >> ((byte)iVar10 & 0x1f);
          bVar17 = uVar13 != uVar15;
          uVar12 = uVar15;
          if (uVar13 < uVar15) {
            uVar12 = uVar13;
          }
          uVar14 = uVar13;
          uVar13 = uVar12;
        } while (bVar17);
      }
      local_48 = (ulong)((uint)bVar5 / (uVar12 << ((byte)iVar11 & 0x1f)) << 2);
    }
  }
  kVar3 = (this->header).supercompressionGlobalData.byteLength;
  if (kVar3 == 0) {
    kVar2 = (this->header).keyValueData.byteLength;
    if (kVar2 == 0) {
      kVar2 = (this->header).dataFormatDescriptor.byteLength;
      if (kVar2 == 0) {
        uVar6 = lVar16 + 0x50;
      }
      else {
        uVar6 = (ulong)(kVar2 + (this->header).dataFormatDescriptor.byteOffset);
      }
    }
    else {
      uVar6 = (ulong)(kVar2 + (this->header).keyValueData.byteOffset);
    }
  }
  else {
    uVar6 = kVar3 + (this->header).supercompressionGlobalData.byteOffset;
  }
  if (local_48 != 0) {
    local_38 = (uVar6 + local_48) - 1;
    local_40 = local_38 % local_48;
    local_60 = 1;
    pkVar7 = (this->levelIndices).
             super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->levelIndices).
                   super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pkVar7 >> 3) *
            -0x5555555555555555;
    if (1 < uVar6) {
      do {
        if (pkVar7[local_60 - 1].uncompressedByteLength < pkVar7[local_60].uncompressedByteLength) {
          local_50 = local_60 - 1;
          error<unsigned_long,unsigned_long&,unsigned_long&,unsigned_long&>
                    (this,&LevelIndex::IncorrectIndexOrder,&local_50,
                     &pkVar7[local_60 - 1].uncompressedByteLength,&local_60,
                     &pkVar7[local_60].uncompressedByteLength);
        }
        pkVar7 = (this->levelIndices).
                 super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if (pkVar7[local_60 - 1].byteOffset < pkVar7[local_60].byteOffset) {
          local_50 = local_60 - 1;
          error<unsigned_long,unsigned_long&,unsigned_long&,unsigned_long&>
                    (this,&LevelIndex::IncorrectLevelOrder,&local_50,
                     &pkVar7[local_60 - 1].byteOffset,&local_60,&pkVar7[local_60].byteOffset);
        }
        local_60 = local_60 + 1;
        pkVar7 = (this->levelIndices).
                 super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar6 = ((long)(this->levelIndices).
                       super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pkVar7 >> 3) *
                -0x5555555555555555;
      } while (local_60 < uVar6);
    }
    if ((int)uVar6 != 0) {
      firstLevelOffset = local_38 - local_40;
      uVar6 = (ulong)((int)uVar6 - 1);
      lVar16 = uVar6 * 0x18 + 0x10;
      lVar8 = 0;
      sVar9 = firstLevelOffset;
      do {
        level = (uint32_t)uVar6;
        pkVar7 = (this->levelIndices).
                 super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl
                 .super__Vector_impl_data._M_start;
        local_54 = level;
        if (((this->header).vkFormat == 0) || ((this->header).supercompressionScheme != 0)) {
          if (local_48 == 0) goto LAB_001aaf85;
          uVar6 = (local_48 + lVar8 + sVar9) - 1;
          local_60 = uVar6 - uVar6 % local_48;
        }
        else {
          local_60 = calcLevelOffset(this,firstLevelOffset,local_48,level);
        }
        args_1 = (unsigned_long *)((long)pkVar7 + lVar16 + -0x10);
        if (*args_1 % local_48 == 0) {
          if (*args_1 != local_60) {
            error<unsigned_int_const&,unsigned_long_const&,unsigned_long_const&>
                      (this,&LevelIndex::IncorrectByteOffset,&local_54,args_1,&local_60);
          }
        }
        else {
          error<unsigned_int_const&,unsigned_long_const&,unsigned_long&,unsigned_long_const&>
                    (this,&LevelIndex::IncorrectByteOffsetUnaligned,&local_54,args_1,&local_48,
                     &local_60);
        }
        kVar2 = (this->header).vkFormat;
        if (kVar2 + 0xc460d100 < 0x1e) {
          uVar12 = (this->expectedBlockDimension2).super__Optional_base<unsigned_char,_true,_true>.
                   _M_payload.super__Optional_payload_base<unsigned_char>._M_payload._M_value + 1;
          if ((this->expectedBlockDimension2).super__Optional_base<unsigned_char,_true,_true>.
              _M_payload.super__Optional_payload_base<unsigned_char>._M_engaged == false) {
            uVar12 = 1;
          }
          if ((this->header).pixelDepth % uVar12 == 0) goto LAB_001aae51;
        }
        else {
LAB_001aae51:
          if ((kVar2 != 0) && ((this->header).supercompressionScheme == 0)) {
            sVar9 = calcLayerSize(this,local_54);
            local_50 = this->numLayers * sVar9;
            if (*(unsigned_long *)((long)pkVar7 + lVar16 + -8) != local_50) {
              error<unsigned_int_const&,unsigned_long_const&,unsigned_long_const&>
                        (this,&LevelIndex::IncorrectByteLength,&local_54,
                         (unsigned_long *)((long)pkVar7 + lVar16 + -8),&local_50);
            }
          }
          kVar2 = (this->header).supercompressionScheme;
          if (kVar2 == 1) {
            if (*(long *)((long)&pkVar7->byteOffset + lVar16) != 0) {
              issue = &LevelIndex::NonZeroUBLForBLZE;
LAB_001aaebd:
              error<unsigned_int_const&,unsigned_long_const&>
                        (this,issue,&local_54,(unsigned_long *)((long)&pkVar7->byteOffset + lVar16))
              ;
            }
          }
          else if ((this->header).vkFormat == 0) {
            uVar6 = *(ulong *)((long)&pkVar7->byteOffset + lVar16);
            if (uVar6 == 0) {
              error<unsigned_int_const&>(this,&LevelIndex::ZeroUncompressedLength,&local_54);
            }
            else {
              iVar10 = this->numLayers * (this->header).faceCount;
              if (uVar6 % (ulong)(iVar10 + (uint)(iVar10 == 0)) != 0) {
                issue = &LevelIndex::InvalidUncompressedLength;
                goto LAB_001aaebd;
              }
            }
          }
          else if (kVar2 == 0) {
            sVar9 = calcLayerSize(this,local_54);
            local_50 = this->numLayers * sVar9;
            if (*(unsigned_long *)((long)&pkVar7->byteOffset + lVar16) != local_50) {
              error<unsigned_int_const&,unsigned_long_const&,unsigned_long_const&>
                        (this,&LevelIndex::IncorrectUncompressedByteLength,&local_54,
                         (unsigned_long *)((long)&pkVar7->byteOffset + lVar16),&local_50);
            }
          }
        }
        sVar9 = *(size_t *)((long)pkVar7 + lVar16 + -0x10);
        lVar8 = *(long *)((long)pkVar7 + lVar16 + -8);
        lVar16 = lVar16 + -0x18;
        uVar6 = (ulong)(level - 1);
      } while (level != 0);
    }
    return;
  }
LAB_001aaf85:
  __assert_fail("alignment != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/utility.h"
                ,0x1d,"T ktx::align(const T, const T) [T = unsigned long]");
}

Assistant:

void ValidationContext::validateLevelIndex() {
    levelIndices.resize(numLevels);

    const auto levelIndexOffset = sizeof(KTX_header2);
    const auto levelIndexSize = sizeof(ktxLevelIndexEntry) * numLevels;
    read(levelIndexOffset, levelIndices.data(), levelIndexSize, "the level index");

    const auto blockByteLength = (expectedBytePlanes ? expectedBytePlanes->at(0) : (parsedBlockByteLength == 0 ? uint8_t(1) : parsedBlockByteLength.value_or(0)));
    std::size_t requiredLevelAlignment = calcLevelAlignment(ktxSupercmpScheme(header.supercompressionScheme), blockByteLength);

    std::size_t expectedFirstLevelOffset = 0;
    if (header.supercompressionGlobalData.byteLength != 0)
        expectedFirstLevelOffset = header.supercompressionGlobalData.byteLength + header.supercompressionGlobalData.byteOffset;
    else if (header.keyValueData.byteLength != 0)
        expectedFirstLevelOffset = header.keyValueData.byteLength + header.keyValueData.byteOffset;
    else if (header.dataFormatDescriptor.byteLength != 0)
        expectedFirstLevelOffset = header.dataFormatDescriptor.byteLength + header.dataFormatDescriptor.byteOffset;
    else
        expectedFirstLevelOffset = levelIndexOffset + levelIndexSize;
    expectedFirstLevelOffset = align(expectedFirstLevelOffset, requiredLevelAlignment);

    // The first (largest) mip level is the first in the index and the last in the file.
    for (std::size_t i = 1; i < levelIndices.size(); ++i) {
        if (levelIndices[i].uncompressedByteLength > levelIndices[i - 1].uncompressedByteLength)
            error(LevelIndex::IncorrectIndexOrder, i - 1, levelIndices[i - 1].uncompressedByteLength, i, levelIndices[i].uncompressedByteLength);

        if (levelIndices[i].byteOffset > levelIndices[i - 1].byteOffset)
            error(LevelIndex::IncorrectLevelOrder, i - 1, levelIndices[i - 1].byteOffset, i, levelIndices[i].byteOffset);
    }

    std::size_t lastByteOffset = expectedFirstLevelOffset; // Reuse lastByteOffset to inject first offset to expectedOffset
    std::size_t lastByteLength = 0;

    // Count down, so we can check the distance between levels for the UNDEFINED and SUPERCOMPRESSION cases.
    for (auto it = static_cast<uint32_t>(levelIndices.size()); it != 0; --it) {
        const auto index = it - 1;
        const auto& level = levelIndices[index];

        // Validate byteOffset
        const auto knownLevelOffset = header.vkFormat != VK_FORMAT_UNDEFINED &&
                header.supercompressionScheme == KTX_SS_NONE;
        // If the exact level sizes are unknown we have to trust the byteLengths.
        // In that case we know where the first level must be in the file, and we can calculate
        // the offsets by progressively summing the lengths and paddings so far.
        const auto expectedOffset = knownLevelOffset ?
                calcLevelOffset(expectedFirstLevelOffset, requiredLevelAlignment, index) :
                align(lastByteOffset + lastByteLength, requiredLevelAlignment);

        if (level.byteOffset % requiredLevelAlignment != 0)
            error(LevelIndex::IncorrectByteOffsetUnaligned, index, level.byteOffset, requiredLevelAlignment, expectedOffset);
        else if (level.byteOffset != expectedOffset)
            error(LevelIndex::IncorrectByteOffset, index, level.byteOffset, expectedOffset);

        // Workaround: Disable ByteLength validations for the 3D ASTC encoder which currently ignores partial Z blocks in our test files
        const auto disableByteLengthValidation = isFormat3DBlockCompressed(VkFormat(header.vkFormat))
                && header.pixelDepth % (expectedBlockDimension2.value_or(0) + 1) != 0;

        if (!disableByteLengthValidation) {
            // Validate byteLength
            if (header.vkFormat != VK_FORMAT_UNDEFINED && header.supercompressionScheme == KTX_SS_NONE) {
                const auto expectedLength = calcLevelSize(index);
                if (level.byteLength != expectedLength)
                    error(LevelIndex::IncorrectByteLength, index, level.byteLength, expectedLength);
            }

            // Validate uncompressedByteLength
            if (header.supercompressionScheme == KTX_SS_BASIS_LZ) {
                if (level.uncompressedByteLength != 0)
                    error(LevelIndex::NonZeroUBLForBLZE, index, level.uncompressedByteLength);
            } else if (header.vkFormat != VK_FORMAT_UNDEFINED) {
                if (header.supercompressionScheme == KTX_SS_NONE) {
                    const auto expectedUncompressedLength = calcLevelSize(index);
                    if (level.uncompressedByteLength != expectedUncompressedLength)
                        error(LevelIndex::IncorrectUncompressedByteLength, index, level.uncompressedByteLength, expectedUncompressedLength);
                }
            } else {
                if (level.uncompressedByteLength == 0)
                    error(LevelIndex::ZeroUncompressedLength, index);
                else if (level.uncompressedByteLength % std::max(header.faceCount * numLayers, 1u) != 0)
                    // On the other branches uncompressedByteLength is always checked exactly,
                    // so this is the only branch where this checks yields useful information
                    error(LevelIndex::InvalidUncompressedLength, index, level.uncompressedByteLength);
            }
        }

        lastByteOffset = level.byteOffset;
        lastByteLength = level.byteLength;
    }
}